

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<double>::Resize
          (RepeatedField<double> *this,int new_size,double *value)

{
  int iVar1;
  LogMessage *other;
  double *pdVar2;
  double *pdVar3;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  double *local_20;
  double *value_local;
  RepeatedField<double> *pRStack_10;
  int new_size_local;
  RepeatedField<double> *this_local;
  
  local_59 = 0;
  local_20 = value;
  value_local._4_4_ = new_size;
  pRStack_10 = this;
  if (new_size < 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "src/../third_party/protobuf-lite/google/protobuf/repeated_field.h",0x50b);
    local_59 = 1;
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: (new_size) >= (0): ");
    internal::LogFinisher::operator=(local_6d,other);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  if (this->current_size_ < value_local._4_4_) {
    Reserve(this,value_local._4_4_);
    pdVar2 = elements(this);
    iVar1 = this->current_size_;
    pdVar3 = elements(this);
    std::fill<double*,double>(pdVar2 + iVar1,pdVar3 + value_local._4_4_,local_20);
  }
  this->current_size_ = value_local._4_4_;
  return;
}

Assistant:

inline void RepeatedField<Element>::Resize(int new_size, const Element& value) {
  GOOGLE_DCHECK_GE(new_size, 0);
  if (new_size > current_size_) {
    Reserve(new_size);
    std::fill(&elements()[current_size_], &elements()[new_size], value);
  }
  current_size_ = new_size;
}